

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

string * __thiscall
google::protobuf::Reflection::GetRepeatedString_abi_cxx11_
          (string *__return_storage_ptr__,Reflection *this,Message *message,FieldDescriptor *field,
          int index)

{
  bool bVar1;
  CppType CVar2;
  int number;
  CppStringType CVar3;
  Reflection *pRVar4;
  Descriptor *actual;
  Descriptor *pDVar5;
  ExtensionSet *this_00;
  string *psVar6;
  Cord *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  int index_local;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  pRVar4 = Message::GetReflection(message);
  if (this != pRVar4) {
    pDVar5 = this->descriptor_;
    actual = Message::GetDescriptor(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar5,actual,field,"GetRepeatedString");
  }
  pDVar5 = FieldDescriptor::containing_type(field);
  if (pDVar5 != this->descriptor_) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"GetRepeatedString","Field does not match message type.");
  }
  bVar1 = FieldDescriptor::is_repeated(field);
  if (!bVar1) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"GetRepeatedString",
               "Field is singular; the method requires a repeated field.");
  }
  CVar2 = FieldDescriptor::cpp_type(field);
  if (CVar2 != CPPTYPE_STRING) {
    anon_unknown_6::ReportReflectionUsageTypeError
              (this->descriptor_,field,"GetRepeatedString",CPPTYPE_STRING);
  }
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    this_00 = GetExtensionSet(this,message);
    number = FieldDescriptor::number(field);
    psVar6 = internal::ExtensionSet::GetRepeatedString_abi_cxx11_(this_00,number,index);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar6);
  }
  else {
    CVar3 = FieldDescriptor::cpp_string_type(field);
    if (CVar3 != kView) {
      if (CVar3 == kCord) {
        this_01 = GetRepeatedField<absl::lts_20250127::Cord>(this,message,field,index);
        absl::lts_20250127::Cord::operator_cast_to_string(__return_storage_ptr__,this_01);
        return __return_storage_ptr__;
      }
      if (CVar3 != kString) {
        internal::Unreachable
                  ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                   ,0x877);
      }
    }
    pbVar7 = GetRepeatedPtrField<std::__cxx11::string>(this,message,field,index);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pbVar7);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Reflection::GetRepeatedString(const Message& message,
                                          const FieldDescriptor* field,
                                          int index) const {
  USAGE_CHECK_ALL(GetRepeatedString, REPEATED, STRING);
  if (field->is_extension()) {
    return GetExtensionSet(message).GetRepeatedString(field->number(), index);
  } else {
    switch (field->cpp_string_type()) {
      case FieldDescriptor::CppStringType::kCord:
        return std::string(GetRepeatedField<absl::Cord>(message, field, index));
      case FieldDescriptor::CppStringType::kView:
      case FieldDescriptor::CppStringType::kString:
        return GetRepeatedPtrField<std::string>(message, field, index);
    }
    internal::Unreachable();
  }
}